

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionaryTestCase.cpp
# Opt level: O3

void __thiscall
SuiteDataDictionaryTests::TestreadFromDocument_TrailerNodeMissing::RunImpl
          (TestreadFromDocument_TrailerNodeMissing *this)

{
  TestResults *this_00;
  PUGIXML_DOMDocument *this_01;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  string dictionaryXml;
  stringbuf buffer;
  istream is;
  DataDictionary dictionary;
  long *local_5d8;
  undefined8 local_5d0;
  long local_5c8 [2];
  code *local_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  locale local_580 [8];
  undefined4 local_578;
  undefined1 *local_570;
  undefined8 local_568;
  undefined1 local_560;
  undefined7 uStack_55f;
  TestDetails local_550;
  long local_530 [2];
  ios_base local_520 [264];
  DataDictionary local_418 [1000];
  
  FIX::DataDictionary::DataDictionary(local_418);
  local_5b8 = __assert_fail;
  local_5b0 = 0;
  uStack_5a8 = 0;
  local_5a0 = 0;
  uStack_598 = 0;
  local_590 = 0;
  uStack_588 = 0;
  std::locale::locale(local_580);
  local_5b8 = FIX::SocketAcceptor::onDisconnect;
  local_578 = 0x18;
  local_568 = 0;
  local_560 = 0;
  local_5d8 = local_5c8;
  local_570 = &local_560;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5d8,
             "<fix type=\'FIX\' major=\'4\' minor=\'2\' servicepack=\'0\'><header><field name=\'BeginString\' required=\'Y\' /></header><fields><field number=\'8\' name=\'BeginString\' type=\'STRING\' ><value enum=\'1\' description=\'SINGLE_SECURITY\' /></field></fields></fix>"
             ,"");
  (**(code **)(local_5b8 + 0x60))(&local_5b8,local_5d8,local_5d0);
  std::istream::istream((istream *)local_530,(streambuf *)&local_5b8);
  this_01 = (PUGIXML_DOMDocument *)operator_new(0xd8);
  FIX::PUGIXML_DOMDocument::PUGIXML_DOMDocument(this_01);
  (**(code **)(*(long *)this_01 + 0x10))(this_01,local_530);
  FIX::DataDictionary::readFromDocument((unique_ptr *)local_418);
  ppTVar1 = UnitTest::CurrentTest::Results();
  this_00 = *ppTVar1;
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_550,*ppTVar2,0x599);
  UnitTest::TestResults::OnTestFailure
            (this_00,&local_550,"Expected exception: \"ConfigError\" not thrown");
  if (this_01 != (PUGIXML_DOMDocument *)0x0) {
    (**(code **)(*(long *)this_01 + 8))();
  }
  local_530[0] = _VTT;
  *(undefined8 *)((long)local_530 + *(long *)(_VTT + -0x18)) = _socket_hostname;
  local_530[1] = 0;
  std::ios_base::~ios_base(local_520);
  if (local_5d8 != local_5c8) {
    operator_delete(local_5d8,local_5c8[0] + 1);
  }
  local_5b8 = FIX::SocketAcceptor::onDisconnect;
  if (local_570 != &local_560) {
    operator_delete(local_570,CONCAT71(uStack_55f,local_560) + 1);
  }
  local_5b8 = __assert_fail;
  std::locale::~locale(local_580);
  FIX::DataDictionary::~DataDictionary(local_418);
  return;
}

Assistant:

TEST(readFromDocument_TrailerNodeMissing) {
  DataDictionary dictionary;

  std::stringbuf buffer;
  std::string dictionaryXml =
      "<fix type='FIX' major='4' minor='2' servicepack='0'>"
        "<header>"
          "<field name='BeginString' required='Y' />"
        "</header>"
        "<fields>"
          "<field number='8' name='BeginString' type='STRING' >"
            "<value enum='1' description='SINGLE_SECURITY' />"
          "</field>"
        "</fields>"
      "</fix>";
  buffer.sputn(dictionaryXml.c_str(), dictionaryXml.size());
  std::istream is(&buffer);

  DOMDocumentPtr pDoc(new PUGIXML_DOMDocument());
  pDoc->load(is);

  CHECK_THROW(dictionary.readFromDocument(pDoc);, ConfigError);
}